

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform.cpp
# Opt level: O2

void __thiscall
pbrt::AnimatedTransform::FindZeros
          (AnimatedTransform *this,Float c1,Float c2,Float c3,Float c4,Float c5,Float theta,
          Interval tInterval,span<float> zeros,int *nZeros,int depth)

{
  float fVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  uint uVar6;
  int iVar7;
  bool bVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  Interval IVar13;
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  float fVar20;
  undefined8 in_XMM6_Qb;
  float local_b8;
  Interval local_80;
  Interval local_78;
  Interval local_70;
  Interval local_68;
  Interval local_60;
  Interval local_58;
  Interval local_50;
  Interval local_48;
  Interval local_40;
  Interval local_38;
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined1 extraout_var_01 [56];
  undefined1 extraout_var_02 [56];
  undefined1 extraout_var_03 [56];
  undefined1 extraout_var_04 [56];
  
  local_b8 = tInterval.low;
  local_48.low = c3;
  local_48.high = c3;
  local_40.low = c2;
  local_40.high = c2;
  local_38.low = c1;
  local_38.high = c1;
  IVar13 = Interval::operator*(&local_48,tInterval);
  auVar14._0_8_ = Interval::operator+(&local_40,IVar13);
  auVar14._8_56_ = extraout_var_01;
  local_78 = (Interval)vmovlps_avx(auVar14._0_16_);
  fVar1 = theta + theta;
  local_50.low = fVar1;
  local_50.high = fVar1;
  IVar13 = Interval::operator*(&local_50,tInterval);
  IVar13 = Cos(IVar13);
  IVar13 = Interval::operator*(&local_78,IVar13);
  auVar15._0_8_ = Interval::operator+(&local_38,IVar13);
  auVar15._8_56_ = extraout_var_02;
  local_70 = (Interval)vmovlps_avx(auVar15._0_16_);
  local_60.low = c5;
  local_60.high = c5;
  local_58.low = c4;
  local_58.high = c4;
  IVar13 = Interval::operator*(&local_60,tInterval);
  auVar16._0_8_ = Interval::operator+(&local_58,IVar13);
  auVar16._8_56_ = extraout_var_03;
  local_80 = (Interval)vmovlps_avx(auVar16._0_16_);
  local_68.low = fVar1;
  local_68.high = fVar1;
  IVar13 = Interval::operator*(&local_68,tInterval);
  IVar13 = Sin(IVar13);
  IVar13 = Interval::operator*(&local_80,IVar13);
  auVar17._0_8_ = Interval::operator+(&local_70,IVar13);
  auVar17._8_56_ = extraout_var_04;
  fVar9 = auVar17._0_4_;
  if (fVar9 <= 0.0) {
    auVar3 = vmovshdup_avx(auVar17._0_16_);
    fVar12 = auVar3._0_4_;
    if (0.0 <= fVar12) {
      if ((fVar9 != fVar12) || (NAN(fVar9) || NAN(fVar12))) {
        if (((int)nZeros < 1) || (fVar12 - fVar9 <= 0.001)) {
          auVar3._8_8_ = in_XMM6_Qb;
          auVar3._0_8_ = tInterval;
          auVar3 = vmovshdup_avx(auVar3);
          fVar9 = (local_b8 + auVar3._0_4_) * 0.5;
          iVar7 = 4;
          while (bVar8 = iVar7 != 0, iVar7 = iVar7 + -1, bVar8) {
            auVar2 = vfmadd132ss_fma(ZEXT416((uint)fVar9),ZEXT416((uint)c2),ZEXT416((uint)c3));
            auVar18._0_4_ = cosf(fVar9 * fVar1);
            auVar18._4_60_ = extraout_var;
            auVar5 = vfmadd213ss_fma(auVar18._0_16_,ZEXT416((uint)auVar2._0_4_),ZEXT416((uint)c1));
            auVar4 = vfmadd132ss_fma(ZEXT416((uint)fVar9),ZEXT416((uint)c4),ZEXT416((uint)c5));
            fVar20 = auVar4._0_4_;
            auVar19._0_4_ = sinf(fVar9 * fVar1);
            auVar19._4_60_ = extraout_var_00;
            auVar4 = vfmadd213ss_fma(auVar19._0_16_,ZEXT416((uint)fVar20),ZEXT416(auVar5._0_4_));
            fVar10 = auVar4._0_4_;
            fVar12 = (fVar9 + fVar9) * theta;
            fVar11 = cosf(fVar12);
            fVar12 = sinf(fVar12);
            if ((fVar10 == 0.0) && (!NAN(fVar10))) break;
            auVar2 = vfmadd213ss_fma(ZEXT416((uint)(auVar2._0_4_ * -2.0)),ZEXT416((uint)theta),
                                     ZEXT416((uint)c5));
            auVar4 = vfmadd213ss_fma(ZEXT416((uint)(fVar20 + fVar20)),ZEXT416((uint)theta),
                                     ZEXT416((uint)c3));
            auVar2 = vfmadd213ss_fma(ZEXT416((uint)fVar11),auVar4,
                                     ZEXT416((uint)(auVar2._0_4_ * fVar12)));
            fVar12 = auVar2._0_4_;
            if ((fVar12 == 0.0) && (!NAN(fVar12))) break;
            fVar9 = fVar9 - fVar10 / fVar12;
          }
          if ((local_b8 + -0.001 <= fVar9) && (fVar9 < auVar3._0_4_ + 0.001)) {
            iVar7 = *(int *)zeros.n;
            (this->startTransform).m.m[0][iVar7] = fVar9;
            *(int *)zeros.n = iVar7 + 1;
          }
        }
        else {
          auVar5._8_8_ = in_XMM6_Qb;
          auVar5._0_8_ = tInterval;
          uVar6 = (int)nZeros - 1;
          auVar4 = vmovshdup_avx(auVar5);
          fVar1 = (local_b8 + auVar4._0_4_) * 0.5;
          auVar2 = vminss_avx(ZEXT416((uint)fVar1),auVar5);
          auVar3 = vmaxss_avx(ZEXT416((uint)fVar1),auVar5);
          auVar3 = vinsertps_avx(auVar2,auVar3,0x10);
          FindZeros(this,c1,c2,c3,c4,c5,theta,auVar3._0_8_,zeros,(int *)(ulong)uVar6,depth);
          auVar2 = vminss_avx(auVar4,ZEXT416((uint)fVar1));
          auVar3 = vmaxss_avx(auVar4,ZEXT416((uint)fVar1));
          auVar3 = vinsertps_avx(auVar2,auVar3,0x10);
          FindZeros(this,c1,c2,c3,c4,c5,theta,auVar3._0_8_,zeros,(int *)(ulong)uVar6,depth);
        }
      }
    }
  }
  return;
}

Assistant:

void AnimatedTransform::FindZeros(Float c1, Float c2, Float c3, Float c4, Float c5,
                                  Float theta, Interval tInterval,
                                  pstd::span<Float> zeros, int *nZeros, int depth) {
    // Evaluate motion derivative in interval form, return if no zeros
    Interval dadt =
        Interval(c1) +
        (Interval(c2) + Interval(c3) * tInterval) * Cos(Interval(2 * theta) * tInterval) +
        (Interval(c4) + Interval(c5) * tInterval) * Sin(Interval(2 * theta) * tInterval);
    if (dadt.LowerBound() > 0 || dadt.UpperBound() < 0 ||
        dadt.LowerBound() == dadt.UpperBound())
        return;

    // Either split range and recurse or report a zero
    if (depth > 0 && dadt.Width() > 1e-3) {
        // Split _tInterval_ and check both resulting intervals
        Float mid = tInterval.Midpoint();
        FindZeros(c1, c2, c3, c4, c5, theta, Interval(tInterval.LowerBound(), mid), zeros,
                  nZeros, depth - 1);
        FindZeros(c1, c2, c3, c4, c5, theta, Interval(mid, tInterval.UpperBound()), zeros,
                  nZeros, depth - 1);

    } else {
        // Use Newton's method to refine zero
        Float tNewton = tInterval.Midpoint();
        for (int i = 0; i < 4; ++i) {
            // Evaluate motion function derivative and its derivative at _tNewton_
            Float fNewton = c1 + (c2 + c3 * tNewton) * std::cos(2 * theta * tNewton) +
                            (c4 + c5 * tNewton) * std::sin(2 * theta * tNewton);
            Float fPrimeNewton =
                (c3 + 2 * (c4 + c5 * tNewton) * theta) * std::cos(2 * tNewton * theta) +
                (c5 - 2 * (c2 + c3 * tNewton) * theta) * std::sin(2 * tNewton * theta);

            if (fNewton == 0 || fPrimeNewton == 0)
                break;
            tNewton = tNewton - fNewton / fPrimeNewton;
        }

        // Record zero if refined zero is in interval
        if (tNewton >= tInterval.LowerBound() - 1e-3f &&
            tNewton < tInterval.UpperBound() + 1e-3f) {
            zeros[*nZeros] = tNewton;
            (*nZeros)++;
        }
    }
}